

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
          (ShaderImageLoadStoreBase *this,int x,int y,int w,int h,vec4 *expected)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  float *pfVar9;
  pointer pVVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  bool local_aa;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> fb;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar8;
  
  pfVar9 = (float *)CONCAT44(in_register_0000000c,w);
  iVar7 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar8 = CONCAT44(extraout_var,iVar7);
  bVar1 = *(byte *)(lVar8 + 8);
  bVar2 = *(byte *)(lVar8 + 0xc);
  bVar3 = *(byte *)(lVar8 + 0x10);
  bVar4 = *(byte *)(lVar8 + 0x14);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&fb,(long)(y * x),(allocator_type *)&local_68);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1406,
             fb.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  local_aa = y < 1;
  if (0 < y) {
    bVar6 = 1;
    iVar12 = 0;
    iVar7 = 0;
    do {
      bVar5 = 0 < x;
      if (0 < x) {
        uVar13 = 1;
        iVar11 = iVar12;
        do {
          pVVar10 = fb.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar11;
          if (((1.0 / (float)(1 << (bVar1 & 0x1f)) <
                ABS(fb.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0] - *pfVar9)) ||
              (1.0 / (float)(1 << (bVar2 & 0x1f)) < ABS(pVVar10->m_data[1] - pfVar9[1]))) ||
             (1.0 / (float)(1 << (bVar3 & 0x1f)) < ABS(pVVar10->m_data[2] - pfVar9[2]))) {
            bVar14 = false;
          }
          else {
            bVar14 = ABS(pVVar10->m_data[3] - pfVar9[3]) <= 1.0 / (float)(1 << (bVar4 & 0x1f));
          }
          if (!bVar14) {
            local_48 = *(undefined8 *)pVVar10->m_data;
            uStack_40 = *(undefined8 *)(pVVar10->m_data + 2);
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                      (&local_68,&local_48,
                       fb.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            anon_unknown_0::Output("First bad color: %s.\n",local_68._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            bVar6 = 0;
          }
          if (!bVar14) break;
          bVar5 = (long)uVar13 < (long)x;
          iVar11 = iVar11 + 1;
          bVar14 = uVar13 != (uint)x;
          uVar13 = uVar13 + 1;
        } while (bVar14);
      }
      if (bVar5) break;
      iVar7 = iVar7 + 1;
      iVar12 = iVar12 + x;
      local_aa = y <= iVar7;
    } while (iVar7 != y);
    local_aa = (bool)(local_aa & bVar6);
  }
  if (fb.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fb.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_aa;
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		bool					 status		  = true;
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec4> fb(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &fb[0]);

		for (int yy = 0; yy < h; ++yy)
		{
			for (int xx = 0; xx < w; ++xx)
			{
				const int idx = yy * w + xx;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					Output("First bad color: %s.\n", ToString(fb[idx]).c_str());
					status = false;
					return status;
				}
			}
		}
		return status;
	}